

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImFont *pIVar1;
  int iVar2;
  ImFont **ppIVar3;
  stbrp_rect *psVar4;
  uchar *puVar5;
  ImFontBuildSrcData *pIVar6;
  ImFontConfig *xpos;
  ImFontAtlas *in_RDI;
  bool bVar7;
  float fVar8;
  float y1_1;
  float x1_1;
  float y0_1;
  float x0_1;
  float unused_y;
  float unused_x;
  stbtt_aligned_quad q;
  stbtt_packedchar *pc;
  int codepoint_1;
  int glyph_i_3;
  float inv_rasterization_scale;
  float font_off_y;
  float font_off_x;
  float descent;
  float ascent;
  int unscaled_line_gap;
  int unscaled_descent;
  int unscaled_ascent;
  float font_scale;
  ImFont *dst_font;
  ImFontConfig *cfg_3;
  ImFontBuildSrcData *src_tmp_6;
  int src_i_6;
  int glyph_i_2;
  stbrp_rect *r;
  uchar multiply_table [256];
  ImFontBuildSrcData *src_tmp_5;
  ImFontConfig *cfg_2;
  int src_i_5;
  int glyph_i_1;
  ImFontBuildSrcData *src_tmp_4;
  int src_i_4;
  stbtt_pack_context spc;
  int TEX_HEIGHT_MAX;
  int surface_sqrt;
  int glyph_index_in_font;
  int y1;
  int x1;
  int y0;
  int x0;
  int glyph_i;
  int padding;
  float scale;
  ImFontConfig *cfg_1;
  ImFontBuildSrcData *src_tmp_3;
  int src_i_3;
  int buf_packedchars_out_n;
  int buf_rects_out_n;
  int total_surface;
  ImVector<stbtt_packedchar> buf_packedchars;
  ImVector<stbrp_rect> buf_rects;
  int dst_i;
  ImFontBuildSrcData *src_tmp_2;
  int src_i_2;
  uint codepoint;
  ImWchar *src_range_1;
  ImFontBuildDstData *dst_tmp_1;
  ImFontBuildSrcData *src_tmp_1;
  int src_i_1;
  int total_glyphs_count;
  ImWchar *src_range;
  ImFontBuildDstData *dst_tmp;
  int font_offset;
  int output_i;
  ImFontConfig *cfg;
  ImFontBuildSrcData *src_tmp;
  int src_i;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  uchar *in_stack_fffffffffffffb68;
  int *lineGap;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  ImFont *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  stbrp_rect *in_stack_fffffffffffffb88;
  stbrp_context *in_stack_fffffffffffffb90;
  ImFontBuildSrcData *in_stack_fffffffffffffb98;
  ImFontConfig *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbb0;
  undefined2 in_stack_fffffffffffffbb4;
  ImWchar in_stack_fffffffffffffbb6;
  int in_stack_fffffffffffffbbc;
  ImFontBuildSrcData *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  float in_stack_fffffffffffffbd0;
  stbrp_rect *in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbec;
  float in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf4;
  stbtt_fontinfo *in_stack_fffffffffffffbf8;
  stbtt_pack_context *in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4c;
  undefined1 in_stack_fffffffffffffc4d;
  undefined1 in_stack_fffffffffffffc4e;
  undefined1 in_stack_fffffffffffffc4f;
  ImFontAtlas *in_stack_fffffffffffffc50;
  ImWchar *local_390;
  undefined1 local_318 [32];
  stbtt_packedchar *local_2f8;
  int local_2ec;
  int local_2e8;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  int local_2cc;
  int local_2c8;
  float local_2c4;
  ImFont *local_2c0;
  ImFontConfig *local_2b8;
  ImFontBuildSrcData *local_2b0;
  int local_2a8;
  int local_2a4;
  stbrp_rect *local_2a0;
  uchar local_298 [256];
  ImFontBuildSrcData *local_198;
  ImFontConfig *local_190;
  int local_188;
  ImVec2 local_184;
  int local_17c;
  ImFontBuildSrcData *local_178;
  int local_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  float local_fc;
  stbtt_fontinfo *local_f8;
  ImFontBuildSrcData *local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  ImVector<stbtt_packedchar> local_d8;
  ImVector<stbrp_rect> local_c8;
  int local_b4;
  ImFontBuildSrcData *local_b0;
  int local_a8;
  uint local_a4;
  ushort *local_a0;
  ImFontAtlas *local_98;
  ImFontBuildSrcData *local_90;
  int local_88;
  int local_84;
  ImWchar *local_80;
  ImFontBuildDstData *local_78;
  int local_6c;
  undefined4 local_68;
  int local_64;
  ImFontConfig *local_60;
  ImFontBuildSrcData *local_58;
  int local_50;
  ImVector<ImFontBuildDstData> local_40;
  ImVector<ImFontBuildSrcData> local_30;
  ImVec2 local_20;
  ImVec2 local_18;
  ImFontAtlas *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  ImFontAtlasBuildInit((ImFontAtlas *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
  ;
  local_10->TexID = (ImTextureID)0x0;
  local_10->TexHeight = 0;
  local_10->TexWidth = 0;
  ImVec2::ImVec2(&local_18,0.0,0.0);
  local_10->TexUvScale = local_18;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  local_10->TexUvWhitePixel = local_20;
  ImFontAtlas::ClearTexData
            ((ImFontAtlas *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  ImVector<ImFontBuildSrcData>::ImVector(&local_30);
  ImVector<ImFontBuildDstData>::ImVector(&local_40);
  ImVector<ImFontBuildSrcData>::resize
            ((ImVector<ImFontBuildSrcData> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  ImVector<ImFontBuildDstData>::resize
            ((ImVector<ImFontBuildDstData> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  iVar2 = ImVector<ImFontBuildSrcData>::size_in_bytes(&local_30);
  memset(local_30.Data,0,(long)iVar2);
  iVar2 = ImVector<ImFontBuildDstData>::size_in_bytes(&local_40);
  memset(local_40.Data,0,(long)iVar2);
  local_50 = 0;
  do {
    if ((local_10->ConfigData).Size <= local_50) {
      local_84 = 0;
      for (local_88 = 0; local_88 < local_30.Size; local_88 = local_88 + 1) {
        local_90 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_88);
        in_stack_fffffffffffffc50 =
             (ImFontAtlas *)ImVector<ImFontBuildDstData>::operator[](&local_40,local_90->DstIndex);
        local_98 = in_stack_fffffffffffffc50;
        ImBitVector::Create((ImBitVector *)
                            CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                            (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
        in_stack_fffffffffffffc4f =
             ImVector<unsigned_int>::empty((ImVector<unsigned_int> *)&local_98->TexDesiredWidth);
        if ((bool)in_stack_fffffffffffffc4f) {
          ImBitVector::Create((ImBitVector *)
                              CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
        }
        local_a0 = local_90->SrcRanges;
        while( true ) {
          bVar7 = false;
          if (*local_a0 != 0) {
            bVar7 = local_a0[1] != 0;
          }
          if (!bVar7) break;
          for (local_a4 = (uint)*local_a0; local_a4 <= local_a0[1]; local_a4 = local_a4 + 1) {
            in_stack_fffffffffffffc4d =
                 ImBitVector::TestBit((ImBitVector *)&local_98->TexDesiredWidth,local_a4);
            if ((!(bool)in_stack_fffffffffffffc4d) &&
               (in_stack_fffffffffffffc48 =
                     stbtt_FindGlyphIndex
                               ((stbtt_fontinfo *)
                                CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20)),
               in_stack_fffffffffffffc48 != 0)) {
              local_90->GlyphsCount = local_90->GlyphsCount + 1;
              *(int *)&local_98->TexID = *(int *)&local_98->TexID + 1;
              ImBitVector::SetBit((ImBitVector *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                  (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
              ImBitVector::SetBit((ImBitVector *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                  (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
              local_84 = local_84 + 1;
            }
          }
          local_a0 = local_a0 + 2;
        }
        in_stack_fffffffffffffc4e = 0;
      }
      for (local_a8 = 0; local_a8 < local_30.Size; local_a8 = local_a8 + 1) {
        local_b0 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_a8);
        ImVector<int>::reserve
                  ((ImVector<int> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
        UnpackBitVectorToFlatIndexList
                  ((ImBitVector *)in_stack_fffffffffffffb90,
                   (ImVector<int> *)in_stack_fffffffffffffb88);
        ImBitVector::Clear((ImBitVector *)0x22a8da);
      }
      for (local_b4 = 0; local_b4 < local_40.Size; local_b4 = local_b4 + 1) {
        ImVector<ImFontBuildDstData>::operator[](&local_40,local_b4);
        ImBitVector::Clear((ImBitVector *)0x22a93e);
      }
      ImVector<ImFontBuildDstData>::clear
                ((ImVector<ImFontBuildDstData> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      ImVector<stbrp_rect>::ImVector(&local_c8);
      ImVector<stbtt_packedchar>::ImVector(&local_d8);
      ImVector<stbrp_rect>::resize
                ((ImVector<stbrp_rect> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
      ImVector<stbtt_packedchar>::resize
                ((ImVector<stbtt_packedchar> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
      iVar2 = ImVector<stbrp_rect>::size_in_bytes(&local_c8);
      memset(local_c8.Data,0,(long)iVar2);
      iVar2 = ImVector<stbtt_packedchar>::size_in_bytes(&local_d8);
      memset(local_d8.Data,0,(long)iVar2);
      local_dc = 0;
      local_e0 = 0;
      local_e4 = 0;
      for (local_e8 = 0; local_e8 < local_30.Size; local_e8 = local_e8 + 1) {
        local_f0 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_e8);
        if (local_f0->GlyphsCount != 0) {
          psVar4 = ImVector<stbrp_rect>::operator[](&local_c8,local_e0);
          local_f0->Rects = psVar4;
          in_stack_fffffffffffffc00 =
               (stbtt_pack_context *)ImVector<stbtt_packedchar>::operator[](&local_d8,local_e4);
          local_f0->PackedChars = (stbtt_packedchar *)in_stack_fffffffffffffc00;
          local_e0 = local_e0 + local_f0->GlyphsCount;
          local_e4 = local_e4 + local_f0->GlyphsCount;
          in_stack_fffffffffffffbf8 =
               (stbtt_fontinfo *)ImVector<ImFontConfig>::operator[](&local_10->ConfigData,local_e8);
          (local_f0->PackRange).font_size =
               (float)in_stack_fffffffffffffbf8->numGlyphs *
               *(float *)((long)&(in_stack_fffffffffffffbf8->charstrings).data + 4);
          (local_f0->PackRange).first_unicode_codepoint_in_range = 0;
          (local_f0->PackRange).array_of_unicode_codepoints = (local_f0->GlyphsList).Data;
          (local_f0->PackRange).num_chars = (local_f0->GlyphsList).Size;
          (local_f0->PackRange).chardata_for_range = local_f0->PackedChars;
          (local_f0->PackRange).h_oversample = (uchar)in_stack_fffffffffffffbf8->loca;
          (local_f0->PackRange).v_oversample = (uchar)in_stack_fffffffffffffbf8->head;
          fVar8 = (float)((ulong)in_stack_fffffffffffffb68 >> 0x20);
          local_f8 = in_stack_fffffffffffffbf8;
          if ((float)in_stack_fffffffffffffbf8->numGlyphs <= 0.0) {
            in_stack_fffffffffffffbec =
                 stbtt_ScaleForMappingEmToPixels
                           ((stbtt_fontinfo *)
                            CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),fVar8);
            in_stack_fffffffffffffbf0 = in_stack_fffffffffffffbec;
          }
          else {
            in_stack_fffffffffffffbf4 =
                 stbtt_ScaleForPixelHeight
                           ((stbtt_fontinfo *)
                            CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),fVar8);
            in_stack_fffffffffffffbf0 = in_stack_fffffffffffffbf4;
          }
          local_100 = local_10->TexGlyphPadding;
          local_fc = in_stack_fffffffffffffbf0;
          for (local_104 = 0; local_104 < (local_f0->GlyphsList).Size; local_104 = local_104 + 1) {
            in_stack_fffffffffffffbe0 =
                 (stbrp_rect *)ImVector<int>::operator[](&local_f0->GlyphsList,local_104);
            local_118 = stbtt_FindGlyphIndex
                                  ((stbtt_fontinfo *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
            stbtt_GetGlyphBitmapBoxSubpixel
                      ((stbtt_fontinfo *)
                       CONCAT26(in_stack_fffffffffffffbb6,
                                CONCAT24(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)),
                       (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                       (float)in_stack_fffffffffffffba8,
                       (float)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                       SUB84(in_stack_fffffffffffffba0,0),
                       (float)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                       &in_stack_fffffffffffffb90->width,&in_stack_fffffffffffffb88->id,
                       (int *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (int *)in_stack_fffffffffffffb78);
            local_f0->Rects[local_104].w = (local_110 - local_108) + local_100 + local_f8->loca + -1
            ;
            local_f0->Rects[local_104].h = (local_114 - local_10c) + local_100 + local_f8->head + -1
            ;
            local_dc = local_f0->Rects[local_104].w * local_f0->Rects[local_104].h + local_dc;
          }
        }
      }
      fVar8 = sqrtf((float)local_dc);
      local_11c = (int)fVar8 + 1;
      local_10->TexHeight = 0;
      if (local_10->TexDesiredWidth < 1) {
        if ((float)local_11c < 2867.2) {
          if ((float)local_11c < 1433.6) {
            in_stack_fffffffffffffbd0 = 7.17465e-43;
            if (716.8 <= (float)local_11c) {
              in_stack_fffffffffffffbd0 = 1.43493e-42;
            }
          }
          else {
            in_stack_fffffffffffffbd0 = 2.86986e-42;
          }
        }
        else {
          in_stack_fffffffffffffbd0 = 5.73972e-42;
        }
        local_10->TexWidth = (int)in_stack_fffffffffffffbd0;
      }
      else {
        local_10->TexWidth = local_10->TexDesiredWidth;
      }
      local_120 = 0x8000;
      local_168._0_12_ = ZEXT812(0);
      local_168._12_4_ = 0;
      lineGap = (int *)0x0;
      local_158 = local_168;
      local_148 = local_168;
      local_138 = local_168;
      stbtt_PackBegin((stbtt_pack_context *)in_stack_fffffffffffffb98,
                      (uchar *)in_stack_fffffffffffffb90,
                      (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88
                      ,in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,
                      (void *)CONCAT26(in_stack_fffffffffffffbb6,
                                       CONCAT24(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                      ));
      ImFontAtlasBuildPackCustomRects
                (in_stack_fffffffffffffc50,
                 (void *)CONCAT17(in_stack_fffffffffffffc4f,
                                  CONCAT16(in_stack_fffffffffffffc4e,
                                           CONCAT15(in_stack_fffffffffffffc4d,
                                                    CONCAT14(in_stack_fffffffffffffc4c,
                                                             in_stack_fffffffffffffc48)))));
      for (local_16c = 0; local_16c < local_30.Size; local_16c = local_16c + 1) {
        in_stack_fffffffffffffbc0 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_16c);
        local_178 = in_stack_fffffffffffffbc0;
        if (in_stack_fffffffffffffbc0->GlyphsCount != 0) {
          stbrp_pack_rects(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                           in_stack_fffffffffffffb84);
          for (local_17c = 0; local_17c < local_178->GlyphsCount; local_17c = local_17c + 1) {
            if (local_178->Rects[local_17c].was_packed != 0) {
              in_stack_fffffffffffffbbc =
                   ImMax<int>(local_10->TexHeight,
                              local_178->Rects[local_17c].y + local_178->Rects[local_17c].h);
              local_10->TexHeight = in_stack_fffffffffffffbbc;
            }
          }
        }
      }
      if ((local_10->Flags & 1U) == 0) {
        iVar2 = ImUpperPowerOfTwo(local_10->TexHeight);
        in_stack_fffffffffffffbb4 = (undefined2)iVar2;
        in_stack_fffffffffffffbb6 = (ImWchar)((uint)iVar2 >> 0x10);
      }
      else {
        iVar2 = local_10->TexHeight + 1;
      }
      local_10->TexHeight = iVar2;
      ImVec2::ImVec2(&local_184,1.0 / (float)local_10->TexWidth,1.0 / (float)local_10->TexHeight);
      local_10->TexUvScale = local_184;
      puVar5 = (uchar *)ImGui::MemAlloc(CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70
                                                ));
      local_10->TexPixelsAlpha8 = puVar5;
      memset(local_10->TexPixelsAlpha8,0,(long)(local_10->TexWidth * local_10->TexHeight));
      local_138._0_8_ = local_10->TexPixelsAlpha8;
      local_158._4_4_ = local_10->TexHeight;
      for (local_188 = 0; local_188 < local_30.Size; local_188 = local_188 + 1) {
        in_stack_fffffffffffffba0 =
             ImVector<ImFontConfig>::operator[](&local_10->ConfigData,local_188);
        local_190 = in_stack_fffffffffffffba0;
        in_stack_fffffffffffffb98 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_188);
        local_198 = in_stack_fffffffffffffb98;
        if (in_stack_fffffffffffffb98->GlyphsCount != 0) {
          stbtt_PackFontRangesRenderIntoRects
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                     (stbtt_pack_range *)
                     CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (int)in_stack_fffffffffffffbec,in_stack_fffffffffffffbe0);
          if ((local_190->RasterizerMultiply != 1.0) || (NAN(local_190->RasterizerMultiply))) {
            ImFontAtlasBuildMultiplyCalcLookupTable(local_298,local_190->RasterizerMultiply);
            local_2a0 = local_198->Rects;
            for (local_2a4 = 0; local_2a4 < local_198->GlyphsCount; local_2a4 = local_2a4 + 1) {
              if (local_2a0->was_packed != 0) {
                lineGap = (int *)CONCAT44((int)((ulong)lineGap >> 0x20),local_10->TexWidth);
                ImFontAtlasBuildMultiplyRectAlpha8
                          (local_298,local_10->TexPixelsAlpha8,local_2a0->x,local_2a0->y,
                           local_2a0->w,local_2a0->h,local_10->TexWidth);
              }
              local_2a0 = local_2a0 + 1;
            }
          }
          local_198->Rects = (stbrp_rect *)0x0;
        }
      }
      stbtt_PackEnd((stbtt_pack_context *)0x22b4d6);
      ImVector<stbrp_rect>::clear
                ((ImVector<stbrp_rect> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      for (local_2a8 = 0; local_2a8 < local_30.Size; local_2a8 = local_2a8 + 1) {
        pIVar6 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_2a8);
        local_2b0 = pIVar6;
        xpos = ImVector<ImFontConfig>::operator[](&local_10->ConfigData,local_2a8);
        local_2c0 = xpos->DstFont;
        local_2b8 = xpos;
        fVar8 = stbtt_ScaleForPixelHeight
                          ((stbtt_fontinfo *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (float)((ulong)lineGap >> 0x20));
        local_2c4 = fVar8;
        stbtt_GetFontVMetrics
                  ((stbtt_fontinfo *)CONCAT44(fVar8,in_stack_fffffffffffffb80),
                   (int *)in_stack_fffffffffffffb78,
                   (int *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),lineGap);
        local_2d4 = ceilf((float)local_2c8 * local_2c4);
        local_2d8 = ImFloor((float)local_2cc * local_2c4);
        ImFontAtlasBuildSetupFont
                  ((ImFontAtlas *)CONCAT44(fVar8,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78,
                   (ImFontConfig *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (float)((ulong)lineGap >> 0x20),SUB84(lineGap,0));
        local_2dc = (local_2b8->GlyphOffset).x;
        local_2e0 = (local_2b8->GlyphOffset).y + (float)(int)(local_2c0->Ascent + 0.5);
        local_2e4 = 1.0 / local_2b8->RasterizerDensity;
        for (local_2e8 = 0; local_2e8 < local_2b0->GlyphsCount; local_2e8 = local_2e8 + 1) {
          in_stack_fffffffffffffb78 =
               (ImFont *)ImVector<int>::operator[](&local_2b0->GlyphsList,local_2e8);
          local_2ec = (in_stack_fffffffffffffb78->IndexAdvanceX).Size;
          local_2f8 = local_2b0->PackedChars + local_2e8;
          uVar9 = (undefined4)((ulong)local_318 >> 0x20);
          in_stack_fffffffffffffb70 = 0;
          stbtt_GetPackedQuad((stbtt_packedchar *)in_stack_fffffffffffffba0,
                              (int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                              (int)in_stack_fffffffffffffb98,(int)((ulong)pIVar6 >> 0x20),
                              (float *)xpos,(float *)CONCAT44(fVar8,in_stack_fffffffffffffb80),
                              (stbtt_aligned_quad *)
                              CONCAT26(in_stack_fffffffffffffbb6,
                                       CONCAT24(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                      ),iVar2);
          lineGap = (int *)CONCAT44(uVar9,local_2f8->xadvance * local_2e4);
          ImFont::AddGlyph((ImFont *)in_stack_fffffffffffffbc0,
                           (ImFontConfig *)CONCAT44(in_stack_fffffffffffffbbc,iVar2),
                           in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0,
                           (float)((ulong)puVar5 >> 0x20),SUB84(puVar5,0),
                           (float)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                           SUB84(in_stack_fffffffffffffba0,0),
                           (float)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                           SUB84(in_stack_fffffffffffffb98,0),(float)((ulong)pIVar6 >> 0x20),
                           in_stack_fffffffffffffbd0);
        }
      }
      ImVector<ImFontBuildSrcData>::clear_destruct
                ((ImVector<ImFontBuildSrcData> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      ImFontAtlasBuildFinish
                ((ImFontAtlas *)
                 CONCAT26(in_stack_fffffffffffffbb6,
                          CONCAT24(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)));
      local_1 = 1;
      local_68 = 1;
      ImVector<stbtt_packedchar>::~ImVector
                ((ImVector<stbtt_packedchar> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      ImVector<stbrp_rect>::~ImVector
                ((ImVector<stbrp_rect> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
LAB_0022b95e:
      ImVector<ImFontBuildDstData>::~ImVector
                ((ImVector<ImFontBuildDstData> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      ImVector<ImFontBuildSrcData>::~ImVector
                ((ImVector<ImFontBuildSrcData> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      return (bool)(local_1 & 1);
    }
    local_58 = ImVector<ImFontBuildSrcData>::operator[](&local_30,local_50);
    local_60 = ImVector<ImFontConfig>::operator[](&local_10->ConfigData,local_50);
    local_58->DstIndex = -1;
    local_64 = 0;
    while( true ) {
      bVar7 = false;
      if (local_64 < (local_10->Fonts).Size) {
        bVar7 = local_58->DstIndex == -1;
      }
      if (!bVar7) break;
      pIVar1 = local_60->DstFont;
      ppIVar3 = ImVector<ImFont_*>::operator[](&local_10->Fonts,local_64);
      if (pIVar1 == *ppIVar3) {
        local_58->DstIndex = local_64;
      }
      local_64 = local_64 + 1;
    }
    if (local_58->DstIndex == -1) {
      local_1 = 0;
      local_68 = 1;
      goto LAB_0022b95e;
    }
    local_6c = stbtt_GetFontOffsetForIndex
                         ((uchar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                          (int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
    iVar2 = stbtt_InitFont((stbtt_fontinfo *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           in_stack_fffffffffffffb68,0);
    if (iVar2 == 0) {
      local_1 = 0;
      local_68 = 1;
      goto LAB_0022b95e;
    }
    local_78 = ImVector<ImFontBuildDstData>::operator[](&local_40,local_58->DstIndex);
    if (local_60->GlyphRanges == (ImWchar *)0x0) {
      local_390 = ImFontAtlas::GetGlyphRangesDefault(local_10);
    }
    else {
      local_390 = local_60->GlyphRanges;
    }
    local_58->SrcRanges = local_390;
    local_80 = local_58->SrcRanges;
    while( true ) {
      bVar7 = false;
      if (*local_80 != 0) {
        bVar7 = local_80[1] != 0;
      }
      if (!bVar7) break;
      iVar2 = ImMax<int>(local_58->GlyphsHighest,(uint)local_80[1]);
      local_58->GlyphsHighest = iVar2;
      local_80 = local_80 + 2;
    }
    local_78->SrcCount = local_78->SrcCount + 1;
    iVar2 = ImMax<int>(local_78->GlyphsHighest,local_58->GlyphsHighest);
    local_78->GlyphsHighest = iVar2;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            IM_ASSERT(0 && "stbtt_InitFont(): failed to parse FontData. It is correct and complete? Check FontDataSize.");
            return false;
        }

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
        {
            // Check for valid range. This may also help detect *some* dangling pointers, because a common
            // user error is to setup ImFontConfig::GlyphRanges with a pointer to data that isn't persistent.
            IM_ASSERT(src_range[0] <= src_range[1]);
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        }
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels * cfg.RasterizerDensity;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0.0f) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels * cfg.RasterizerDensity) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels * cfg.RasterizerDensity);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImCeil(unscaled_ascent * font_scale);
        const float descent = ImFloor(unscaled_descent * font_scale);
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        const float inv_rasterization_scale = 1.0f / cfg.RasterizerDensity;

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            float x0 = q.x0 * inv_rasterization_scale + font_off_x;
            float y0 = q.y0 * inv_rasterization_scale + font_off_y;
            float x1 = q.x1 * inv_rasterization_scale + font_off_x;
            float y1 = q.y1 * inv_rasterization_scale + font_off_y;
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, x0, y0, x1, y1, q.s0, q.t0, q.s1, q.t1, pc.xadvance * inv_rasterization_scale);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}